

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_NewScObject_A_Impl
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout,RegSlot *target)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  VarArrayVarCount *pVVar4;
  undefined4 *puVar5;
  Var pvVar6;
  ulong uVar7;
  uint local_38;
  
  pVVar4 = ByteCodeReader::ReadVarArrayVarCount
                     ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  pvVar6 = pVVar4->count;
  if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a55b24;
    *puVar5 = 0;
  }
  if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar3) {
LAB_00a55b24:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_38 = (uint)pvVar6;
  if (0 < (int)local_38) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 1;
    do {
      pvVar1 = pVVar4[uVar7].count;
      if (*(ulong *)(this + 0x30) <=
          (ulong)(uint)((int)(uVar7 & 0xffff) * 8) + *(long *)(this + 0x28)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x93a,"(m_outParams + outRegisterID < m_outSp)",
                                    "m_outParams + outRegisterID < m_outSp");
        if (!bVar3) goto LAB_00a55b24;
        *puVar5 = 0;
      }
      *(Var *)(*(long *)(this + 0x28) + (uVar7 & 0xffff) * 8) = pvVar1;
      bVar3 = uVar7 != (local_38 & 0x7fffffff);
      uVar7 = uVar7 + 1;
    } while (bVar3);
  }
  pvVar1 = *(Var *)(this + (ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1 * 8 + 0x160);
  ValidateRegValue(this,pvVar1,false,true);
  pvVar6 = NewScObject_Helper(this,pvVar1,(short)pvVar6 + 1,(AuxArray<unsigned_int> *)0x0);
  SetReg<unsigned_int>(this,playout->R0,pvVar6);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObject_A_Impl(const unaligned OpLayoutAuxiliary * playout, RegSlot *target)
    {
        const Js::VarArrayVarCount * vars = Js::ByteCodeReader::ReadVarArrayVarCount(playout->Offset, this->GetFunctionBody());

        int count = Js::TaggedInt::ToInt32(vars->count);

        // Push the parameters to stack
        for (int i = 0; i < count; i++)
        {
            SetOut((ArgSlot)(i + 1), vars->elements[i]);
        }

        Var newVarInstance = NewScObject_Helper(GetReg((RegSlot)playout->C1), (ArgSlot)count + 1);
        SetReg((RegSlot)playout->R0, newVarInstance);

    }